

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O1

void ssh1_bpp_handle_input(BinaryPacketProtocol *bpp)

{
  int iVar1;
  toplevel_callback_fn_t p_Var2;
  long *plVar3;
  InteractorVtable *pIVar4;
  LogContext *ctx;
  Interactor *pIVar5;
  _Bool _Var6;
  char cVar7;
  uint uVar8;
  uint32_t uVar9;
  int n_blanks;
  PacketQueueNode *pPVar10;
  Ssh *pSVar11;
  Ssh *pSVar12;
  char *pcVar13;
  long lVar14;
  _func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *p_Var15;
  size_t sVar16;
  IdempotentCallback *addend;
  Ssh *pSVar17;
  byte bVar18;
  ptrlen pkt;
  ptrlen data;
  int decomplen;
  uchar lenbuf [4];
  uchar *decompblk;
  
  bVar18 = 0;
  iVar1 = *(int *)&bpp[-1].out_pq.pqb.end.next;
  if (iVar1 == 0xa9) goto LAB_0011ac7f;
  if (iVar1 == 0x8f) goto LAB_0011abce;
  if (iVar1 == 0) {
    while( true ) {
      bpp[-1].out_pq.pqb.total_size = 0;
      bpp[-1].out_pq.pqb.ic = (IdempotentCallback *)0x0;
      *(undefined4 *)&bpp[-1].out_pq.pqb.end.next = 0x8f;
LAB_0011abce:
      _Var6 = bufchain_try_fetch_consume(bpp->in_raw,lenbuf,4);
      if (!_Var6) {
        if (bpp->input_eof != true) {
          return;
        }
        if (!_Var6) goto LAB_0011af32;
      }
      ssh_check_frozen(bpp->ssh);
      uVar8 = (uint)lenbuf >> 0x18 | ((uint)lenbuf & 0xff0000) >> 8 | ((uint)lenbuf & 0xff00) << 8 |
              (int)lenbuf << 0x18;
      pPVar10 = (PacketQueueNode *)(long)(int)uVar8;
      bpp[-1].out_pq.pqb.end.prev = pPVar10;
      if (uVar8 - 0x40001 < 0xfffc0004) break;
      sVar16 = 8 - (ulong)((uint)lenbuf >> 0x18 & 7);
      bpp[-1].out_pq.pqb.end.formal_size = sVar16;
      sVar16 = sVar16 + (long)pPVar10;
      *(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue = sVar16;
      bpp[-1].out_pq.pqb.total_size = (size_t)&pPVar10[-1].field_0x1b;
      pSVar11 = (Ssh *)safemalloc(1,0x58,sVar16);
      bpp[-1].ssh = pSVar11;
      *(undefined1 *)&(pSVar11->plug).vt = 0;
      *(undefined4 *)&pSVar11->s = 0;
      pSVar11->conf = (Conf *)0x0;
      (pSVar11->version_receiver).got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)0x0;
      bpp[-1].out_pq.pqb.ic = *(IdempotentCallback **)&bpp[-1].out_pq.pqb.end.on_free_queue;
      bpp[-1].out_pq.after =
           (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)&pSVar11->ldisc;
      *(undefined4 *)&bpp[-1].out_pq.pqb.end.next = 0xa9;
LAB_0011ac7f:
      _Var6 = bufchain_try_fetch_consume
                        (bpp->in_raw,bpp[-1].out_pq.after,
                         *(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue);
      if (!_Var6) {
        if (bpp->input_eof != true) {
          return;
        }
        if (!_Var6) {
LAB_0011af32:
          if (bpp->expect_close != false) {
            ssh_remote_eof(bpp->ssh,"Remote side closed network connection");
            return;
          }
          ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
          return;
        }
      }
      ssh_check_frozen(bpp->ssh);
      if ((bpp[-1].ic_in_raw.fn != (toplevel_callback_fn_t)0x0) &&
         (_Var6 = detect_attack(*(crcda_ctx **)&bpp[-1].ic_in_raw.queued,
                                (uchar *)bpp[-1].out_pq.after,
                                *(uint32_t *)&bpp[-1].out_pq.pqb.end.on_free_queue,
                                (uchar *)&bpp[-1].ic_out_pq), _Var6)) {
        pSVar11 = bpp->ssh;
        pcVar13 = "Network attack (CRC compensation) detected!";
        goto LAB_0011af70;
      }
      lVar14 = *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue;
      if (lVar14 < 8) {
        __assert_fail("s->biglen >= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c"
                      ,0xb3,"void ssh1_bpp_handle_input(BinaryPacketProtocol *)");
      }
      p_Var2 = bpp[-1].ic_in_raw.fn;
      bpp[-1].ic_out_pq.fn = *(toplevel_callback_fn_t *)(bpp[-1].out_pq.after + lVar14 + -8);
      if (p_Var2 != (toplevel_callback_fn_t)0x0) {
        (**(code **)(*(long *)p_Var2 + 0x28))();
      }
      data.len = *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue - 4;
      data.ptr = bpp[-1].out_pq.after;
      uVar9 = crc32_ssh1(data);
      *(uint32_t *)&bpp[-1].pls = uVar9;
      p_Var15 = bpp[-1].out_pq.after;
      uVar8 = *(uint *)(p_Var15 + *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue + -4);
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      *(uint *)((long)&bpp[-1].pls + 4) = uVar8;
      if (uVar8 != uVar9) {
        pSVar11 = bpp->ssh;
        pcVar13 = "Incorrect CRC received on packet";
        goto LAB_0011af70;
      }
      plVar3 = *(long **)&bpp[-1].remote_bugs;
      if (plVar3 != (long *)0x0) {
        cVar7 = (**(code **)(*plVar3 + 0x38))
                          (plVar3,p_Var15 + bpp[-1].out_pq.pqb.end.formal_size,
                           (int)bpp[-1].out_pq.pqb.total_size + 1,&decompblk,&decomplen);
        if (cVar7 == '\0') {
          ssh_sw_abort(bpp->ssh,"Zlib decompression encountered invalid data");
          *(undefined4 *)&bpp[-1].out_pq.pqb.end.next = 0;
        }
        else {
          addend = (IdempotentCallback *)((long)decomplen + bpp[-1].out_pq.pqb.end.formal_size);
          if ((long)bpp[-1].out_pq.pqb.ic < (long)addend) {
            pSVar11 = bpp[-1].ssh;
            bpp[-1].out_pq.pqb.ic = addend;
            pSVar12 = (Ssh *)safemalloc(1,0x58,(size_t)addend);
            bpp[-1].ssh = pSVar12;
            pSVar17 = pSVar11;
            for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
              pSVar12->s = pSVar17->s;
              pSVar17 = (Ssh *)((long)pSVar17 + (ulong)bVar18 * -0x10 + 8);
              pSVar12 = (Ssh *)((long)pSVar12 + (ulong)bVar18 * -0x10 + 8);
            }
            sVar16 = *(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue;
            bpp[-1].out_pq.after =
                 (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)
                 &(bpp[-1].ssh)->ldisc;
            smemclr(pSVar11,sVar16);
            safefree(pSVar11);
          }
          memcpy(bpp[-1].out_pq.after + bpp[-1].out_pq.pqb.end.formal_size,decompblk,(long)decomplen
                );
          safefree(decompblk);
          bpp[-1].out_pq.pqb.total_size = (long)decomplen - 1;
        }
        if (cVar7 == '\0') {
          return;
        }
      }
      p_Var15 = bpp[-1].out_pq.after + bpp[-1].out_pq.pqb.end.formal_size;
      pkt.ptr = (BackendVtable *)(p_Var15 + 1);
      bpp[-1].out_pq.after =
           (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)pkt.ptr;
      pSVar11 = bpp[-1].ssh;
      *(uint *)&pSVar11->s = (uint)(byte)*p_Var15;
      pIVar4 = (InteractorVtable *)bpp[-1].out_pq.pqb.total_size;
      (pSVar11->backend).vt = pkt.ptr;
      (pSVar11->interactor).vt = pIVar4;
      (pSVar11->backend).interactor = (Interactor *)0x0;
      *(undefined4 *)&(pSVar11->interactor).parent = 0;
      (pSVar11->interactor).last_to_talk = (Interactor *)&pSVar11->backend;
      if (bpp->logctx != (LogContext *)0x0) {
        pkt.len = (size_t)pIVar4;
        n_blanks = ssh1_censor_packet(bpp->pls,*(int *)&pSVar11->s,false,pkt,
                                      (logblank_t *)&decompblk);
        ctx = bpp->logctx;
        iVar1 = *(int *)&(bpp[-1].ssh)->s;
        pcVar13 = ssh1_pkt_type(iVar1);
        pSVar11 = bpp[-1].ssh;
        pIVar5 = (pSVar11->backend).interactor;
        log_packet(ctx,0,iVar1,pcVar13,(void *)((long)&pIVar5->vt + (long)(pSVar11->backend).vt),
                   (long)(pSVar11->interactor).vt - (long)pIVar5,n_blanks,(logblank_t *)&decompblk,
                   (unsigned_long *)0x0,0,(char *)0x0);
      }
      pSVar11 = bpp[-1].ssh;
      *(long *)&pSVar11->remote_bugs =
           (long)(pSVar11->interactor).vt - (long)(pSVar11->backend).interactor;
      pq_base_push(&(bpp->in_pq).pqb,(PacketQueueNode *)&pSVar11->conf);
      uVar8 = *(uint *)&(bpp[-1].ssh)->s;
      bpp[-1].ssh = (Ssh *)0x0;
      if (((uVar8 & 0xfffffffe) == 0xe) && (*(char *)&bpp[-1].ic_out_pq.ctx == '\x01')) {
        if (uVar8 == 0xe) {
          ssh1_bpp_start_compression(bpp);
        }
        *(undefined1 *)&bpp[-1].ic_out_pq.ctx = 0;
        queue_idempotent_callback(&bpp->ic_out_pq);
      }
    }
    pSVar11 = bpp->ssh;
    pcVar13 = "Out-of-range packet length from remote suggests data stream corruption";
LAB_0011af70:
    ssh_sw_abort(pSVar11,pcVar13);
  }
  *(undefined4 *)&bpp[-1].out_pq.pqb.end.next = 0;
  return;
}

Assistant:

static void ssh1_bpp_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);

    crBegin(s->crState);

    while (1) {
        s->maxlen = 0;
        s->length = 0;

        {
            unsigned char lenbuf[4];
            BPP_READ(lenbuf, 4);
            s->len = toint(GET_32BIT_MSB_FIRST(lenbuf));
        }

        if (s->len < 5 || s->len > 262144) { /* SSH1.5-mandated max size */
            ssh_sw_abort(s->bpp.ssh,
                         "Out-of-range packet length from remote suggests"
                         " data stream corruption");
            crStopV;
        }

        s->pad = 8 - (s->len % 8);
        s->biglen = s->len + s->pad;
        s->length = s->len - 5;

        /*
         * Allocate the packet to return, now we know its length.
         */
        s->pktin = snew_plus(PktIn, s->biglen);
        s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
        s->pktin->qnode.on_free_queue = false;
        s->pktin->type = 0;

        s->maxlen = s->biglen;
        s->data = snew_plus_get_aux(s->pktin);

        BPP_READ(s->data, s->biglen);

        if (s->cipher_in && detect_attack(s->crcda_ctx,
                                          s->data, s->biglen, s->iv)) {
            ssh_sw_abort(s->bpp.ssh,
                         "Network attack (CRC compensation) detected!");
            crStopV;
        }
        /* Save the last cipher block, to be passed to the next call
         * to detect_attack */
        assert(s->biglen >= 8);
        memcpy(s->iv, s->data + s->biglen - 8, sizeof(s->iv));

        if (s->cipher_in)
            ssh_cipher_decrypt(s->cipher_in, s->data, s->biglen);

        s->realcrc = crc32_ssh1(make_ptrlen(s->data, s->biglen - 4));
        s->gotcrc = GET_32BIT_MSB_FIRST(s->data + s->biglen - 4);
        if (s->gotcrc != s->realcrc) {
            ssh_sw_abort(s->bpp.ssh, "Incorrect CRC received on packet");
            crStopV;
        }

        if (s->decompctx) {
            unsigned char *decompblk;
            int decomplen;
            if (!ssh_decompressor_decompress(
                    s->decompctx, s->data + s->pad, s->length + 1,
                    &decompblk, &decomplen)) {
                ssh_sw_abort(s->bpp.ssh,
                             "Zlib decompression encountered invalid data");
                crStopV;
            }

            if (s->maxlen < s->pad + decomplen) {
                PktIn *old_pktin = s->pktin;

                s->maxlen = s->pad + decomplen;
                s->pktin = snew_plus(PktIn, s->maxlen);
                *s->pktin = *old_pktin; /* structure copy */
                s->data = snew_plus_get_aux(s->pktin);

                smemclr(old_pktin, s->biglen);
                sfree(old_pktin);
            }

            memcpy(s->data + s->pad, decompblk, decomplen);
            sfree(decompblk);
            s->length = decomplen - 1;
        }

        /*
         * Now we can find the bounds of the semantic content of the
         * packet, and the initial type byte.
         */
        s->data += s->pad;
        s->pktin->type = *s->data++;
        BinarySource_INIT(s->pktin, s->data, s->length);

        if (s->bpp.logctx) {
            logblank_t blanks[MAX_BLANKS];
            int nblanks = ssh1_censor_packet(
                s->bpp.pls, s->pktin->type, false,
                make_ptrlen(s->data, s->length), blanks);
            log_packet(s->bpp.logctx, PKT_INCOMING, s->pktin->type,
                       ssh1_pkt_type(s->pktin->type),
                       get_ptr(s->pktin), get_avail(s->pktin), nblanks, blanks,
                       NULL, 0, NULL);
        }

        s->pktin->qnode.formal_size = get_avail(s->pktin);
        pq_push(&s->bpp.in_pq, s->pktin);

        {
            int type = s->pktin->type;
            s->pktin = NULL;

            switch (type) {
              case SSH1_SMSG_SUCCESS:
              case SSH1_SMSG_FAILURE:
                if (s->pending_compression_request) {
                    /*
                     * This is the response to
                     * SSH1_CMSG_REQUEST_COMPRESSION.
                     */
                    if (type == SSH1_SMSG_SUCCESS) {
                        /*
                         * If the response was positive, start
                         * compression.
                         */
                        ssh1_bpp_start_compression(&s->bpp);
                    }

                    /*
                     * Either way, cancel the pending flag, and
                     * schedule a run of our output side in case we
                     * had any packets queued up in the meantime.
                     */
                    s->pending_compression_request = false;
                    queue_idempotent_callback(&s->bpp.ic_out_pq);
                }
                break;
            }
        }
    }

  eof:
    if (!s->bpp.expect_close) {
        ssh_remote_error(s->bpp.ssh,
                         "Remote side unexpectedly closed network connection");
    } else {
        ssh_remote_eof(s->bpp.ssh, "Remote side closed network connection");
    }
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}